

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deep.cpp
# Opt level: O3

void anon_unknown.dwarf_37f77::generateRandomScanFile
               (string *filename,int channelCount,Compression compression)

{
  long lVar1;
  PixelType PVar2;
  PixelType PVar3;
  char cVar4;
  Array2D<void_*> *pAVar5;
  result_type rVar6;
  ostream *this;
  long *plVar7;
  ulong size;
  string *psVar8;
  void *pvVar9;
  void *pvVar10;
  int *piVar11;
  int j;
  long lVar12;
  int i;
  uint uVar13;
  ushort uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ushort uVar18;
  uint uVar19;
  ulong uVar20;
  int j_1;
  long lVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  float fVar25;
  Array<Imf_3_2::Array2D<void_*>_> data;
  int type;
  undefined4 uStack_294;
  long local_288 [2];
  default_random_engine generator;
  DeepScanLineOutputFile file;
  DeepFrameBuffer frameBuffer;
  stringstream ss;
  ostream local_1e0 [112];
  ios_base local_170 [264];
  Channel local_68 [56];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  generating deep scanline file \'",0x21);
  this = std::__ostream_insert<char,std::char_traits<char>>
                   ((ostream *)&std::cout,(filename->_M_dataplus)._M_p,filename->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(this,"\' compression ",0xe);
  plVar7 = (long *)std::ostream::operator<<(this,compression);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  frameBuffer._map._M_t._M_impl._0_8_ = 0;
  Imf_3_2::Header::Header
            ((Header *)&ss,(Box *)(anonymous_namespace)::displayWindow,
             (Box *)&(anonymous_namespace)::dataWindow,1.0,(Vec2 *)&frameBuffer,1.0,INCREASING_Y,
             compression);
  Imf_3_2::Header::operator=((Header *)(anonymous_namespace)::header,(Header *)&ss);
  Imf_3_2::Header::~Header((Header *)&ss);
  generator._M_x = 1;
  if (DAT_00197968._M_current != (anonymous_namespace)::channelTypes) {
    DAT_00197968._M_current = (anonymous_namespace)::channelTypes;
  }
  size = (ulong)(uint)channelCount;
  if (channelCount < 1) {
    Imf_3_2::Header::setType((string *)(anonymous_namespace)::header);
    Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::Array(&data,(long)channelCount);
  }
  else {
    iVar22 = 0;
    do {
      _ss = 0x200000000;
      type = std::uniform_int_distribution<int>::operator()
                       ((uniform_int_distribution<int> *)&ss,&generator,(param_type *)&ss);
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1e0,iVar22);
      std::__cxx11::stringbuf::str();
      if (type == 0) {
        psVar8 = (string *)Imf_3_2::Header::channels();
        Imf_3_2::Channel::Channel(local_68,UINT,1,1,false);
        Imf_3_2::ChannelList::insert(psVar8,(Channel *)&frameBuffer);
      }
      if (type == 1) {
        psVar8 = (string *)Imf_3_2::Header::channels();
        Imf_3_2::Channel::Channel(local_68,HALF,1,1,false);
        Imf_3_2::ChannelList::insert(psVar8,(Channel *)&frameBuffer);
      }
      if (type == 2) {
        psVar8 = (string *)Imf_3_2::Header::channels();
        Imf_3_2::Channel::Channel(local_68,FLOAT,1,1,false);
        Imf_3_2::ChannelList::insert(psVar8,(Channel *)&frameBuffer);
      }
      if (DAT_00197968._M_current == DAT_00197970) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&(anonymous_namespace)::channelTypes,
                   DAT_00197968,&type);
      }
      else {
        *DAT_00197968._M_current = type;
        DAT_00197968._M_current = DAT_00197968._M_current + 1;
      }
      if ((_Base_ptr *)frameBuffer._map._M_t._M_impl._0_8_ !=
          &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)frameBuffer._map._M_t._M_impl._0_8_,
                        (ulong)((long)&(frameBuffer._map._M_t._M_impl.super__Rb_tree_header.
                                        _M_header._M_parent)->_M_color + 1));
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::ios_base::~ios_base(local_170);
      iVar22 = iVar22 + 1;
    } while (channelCount != iVar22);
    Imf_3_2::Header::setType((string *)(anonymous_namespace)::header);
    Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::Array(&data,size);
    if (0 < channelCount) {
      lVar21 = 0;
      do {
        pAVar5 = data._data;
        pvVar9 = operator_new__(0x5a1c8);
        pvVar10 = *(void **)((long)&pAVar5->_data + lVar21);
        if (pvVar10 != (void *)0x0) {
          operator_delete__(pvVar10);
        }
        *(undefined8 *)((long)&pAVar5->_sizeX + lVar21) = 0xa9;
        *(undefined8 *)((long)&pAVar5->_sizeY + lVar21) = 0x111;
        *(void **)((long)&pAVar5->_data + lVar21) = pvVar9;
        lVar21 = lVar21 + 0x18;
      } while (size * 0x18 != lVar21);
    }
  }
  pvVar10 = operator_new__(0x2d0e4);
  if ((anonymous_namespace)::sampleCountScans._16_8_ != 0) {
    operator_delete__((void *)(anonymous_namespace)::sampleCountScans._16_8_);
  }
  (anonymous_namespace)::sampleCountScans._0_8_ = 0xa9;
  (anonymous_namespace)::sampleCountScans._8_8_ = 0x111;
  (anonymous_namespace)::sampleCountScans._16_8_ = pvVar10;
  remove((filename->_M_dataplus)._M_p);
  Imf_3_2::DeepScanLineOutputFile::DeepScanLineOutputFile
            (&file,(filename->_M_dataplus)._M_p,(Header *)(anonymous_namespace)::header,8);
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_2::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
  Imf_3_2::Slice::Slice
            ((Slice *)&ss,UINT,
             (char *)((anonymous_namespace)::sampleCountScans._16_8_ +
                      (long)(anonymous_namespace)::dataWindow * -4 + (long)DAT_00197944 * -0x444),4,
             0x444,1,1,0.0,false,false);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  if (0 < channelCount) {
    lVar21 = 0x10;
    uVar20 = 0;
    do {
      PVar2 = (anonymous_namespace)::channelTypes[uVar20];
      PVar3 = (uint)(PVar2 != UINT) * 3;
      if (PVar2 == HALF) {
        PVar3 = PVar2;
      }
      if (PVar2 == FLOAT) {
        PVar3 = PVar2;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1e0,(int)uVar20);
      std::__cxx11::stringbuf::str();
      iVar22 = (anonymous_namespace)::channelTypes[uVar20];
      uVar17 = (ulong)(iVar22 == 0) << 2;
      if (iVar22 == 1) {
        uVar17 = 2;
      }
      if (iVar22 == 2) {
        uVar17 = 4;
      }
      Imf_3_2::DeepSlice::DeepSlice
                ((DeepSlice *)local_68,PVar3,
                 (char *)(*(long *)((long)&(data._data)->_sizeX + lVar21) +
                          (long)(anonymous_namespace)::dataWindow * -8 + (long)DAT_00197944 * -0x888
                         ),8,0x888,uVar17,1,1,0.0,false,false);
      Imf_3_2::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&type);
      if ((long *)CONCAT44(uStack_294,type) != local_288) {
        operator_delete((long *)CONCAT44(uStack_294,type),local_288[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::ios_base::~ios_base(local_170);
      uVar20 = uVar20 + 1;
      lVar21 = lVar21 + 0x18;
    } while (size != uVar20);
  }
  Imf_3_2::DeepScanLineOutputFile::setFrameBuffer((DeepFrameBuffer *)&file);
  lVar21 = 0;
  do {
    lVar12 = 0;
    do {
      _ss = 0x900000000;
      rVar6 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&ss,&generator,(param_type *)&ss);
      lVar24 = (anonymous_namespace)::sampleCountScans._16_8_;
      uVar20 = (ulong)(rVar6 + 1U);
      lVar23 = (anonymous_namespace)::sampleCountScans._8_8_ * lVar21;
      *(uint *)((anonymous_namespace)::sampleCountScans._16_8_ + lVar23 * 4 + lVar12 * 4) =
           rVar6 + 1U;
      if (0 < channelCount) {
        uVar19 = (uint)((int)lVar12 + (int)lVar21 * 0x111) % 0x801;
        fVar25 = (float)uVar19;
        uVar13 = (uint)fVar25 & 0x7fffff | 0x800000;
        cVar4 = (char)((uint)fVar25 >> 0x17);
        uVar15 = (uint)fVar25 >> 0xd & 0x3ff;
        uVar14 = (ushort)uVar15 | 0x7c00 | (ushort)(uVar15 == 0);
        uVar18 = (ushort)((int)fVar25 + 0x8000fff + (uint)(((uint)fVar25 >> 0xd & 1) != 0) >> 0xd);
        if (0x477fefff < (uint)fVar25) {
          uVar18 = 0x7c00;
        }
        if (fVar25 == INFINITY) {
          uVar14 = 0x7c00;
        }
        if ((uint)fVar25 < 0x7f800000) {
          uVar14 = uVar18;
        }
        uVar18 = (ushort)(0x80000000 < uVar13 << (cVar4 + 0xa2U & 0x1f)) +
                 (short)(uVar13 >> (0x7eU - cVar4 & 0x1f));
        if ((uint)fVar25 < 0x33000001) {
          uVar18 = 0;
        }
        if (0x387fffff < (uint)fVar25) {
          uVar18 = uVar14;
        }
        uVar17 = 0;
        piVar11 = (anonymous_namespace)::channelTypes;
        do {
          iVar22 = piVar11[uVar17];
          if (iVar22 == 0) {
            pvVar10 = operator_new__(uVar20 << 2);
            data._data[uVar17]._data[data._data[uVar17]._sizeY * lVar21 + lVar12] = pvVar10;
            iVar22 = (anonymous_namespace)::channelTypes[uVar17];
            piVar11 = (anonymous_namespace)::channelTypes;
            lVar24 = (anonymous_namespace)::sampleCountScans._16_8_;
          }
          if (iVar22 == 1) {
            pvVar10 = operator_new__((ulong)*(uint *)(lVar24 + lVar23 * 4 + lVar12 * 4) * 2);
            data._data[uVar17]._data[data._data[uVar17]._sizeY * lVar21 + lVar12] = pvVar10;
            iVar22 = (anonymous_namespace)::channelTypes[uVar17];
            piVar11 = (anonymous_namespace)::channelTypes;
            lVar24 = (anonymous_namespace)::sampleCountScans._16_8_;
          }
          if (iVar22 == 2) {
            pvVar10 = operator_new__((ulong)*(uint *)(lVar24 + lVar23 * 4 + lVar12 * 4) << 2);
            data._data[uVar17]._data[data._data[uVar17]._sizeY * lVar21 + lVar12] = pvVar10;
            piVar11 = (anonymous_namespace)::channelTypes;
            lVar24 = (anonymous_namespace)::sampleCountScans._16_8_;
          }
          lVar1 = lVar24 + lVar23 * 4;
          if (*(int *)(lVar1 + lVar12 * 4) == 0) {
            uVar20 = 0;
          }
          else {
            iVar22 = piVar11[uVar17];
            uVar16 = 0;
            do {
              if (iVar22 == 0) {
                *(uint *)((long)data._data[uVar17]._data
                                [data._data[uVar17]._sizeY * lVar21 + lVar12] + uVar16 * 4) = uVar19
                ;
                iVar22 = piVar11[uVar17];
              }
              if (iVar22 == 2) {
                *(float *)((long)data._data[uVar17]._data
                                 [data._data[uVar17]._sizeY * lVar21 + lVar12] + uVar16 * 4) =
                     fVar25;
              }
              else if (iVar22 == 1) {
                *(ushort *)
                 ((long)data._data[uVar17]._data[data._data[uVar17]._sizeY * lVar21 + lVar12] +
                 uVar16 * 2) = uVar18;
              }
              uVar16 = uVar16 + 1;
              uVar20 = (ulong)*(uint *)(lVar1 + lVar12 * 4);
            } while (uVar16 < uVar20);
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != size);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x111);
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0xa9);
  Imf_3_2::DeepScanLineOutputFile::writePixels((int)&file);
  lVar21 = 0;
  do {
    lVar12 = 0;
    do {
      if (0 < channelCount) {
        lVar24 = 4;
        uVar20 = 0;
        piVar11 = (anonymous_namespace)::channelTypes;
        do {
          iVar22 = piVar11[uVar20];
          if (iVar22 == 0) {
            pvVar10 = *(void **)(*(long *)((long)data._data + lVar24 * 4 + -8) * lVar21 * 8 +
                                 *(long *)((long)&(data._data)->_sizeX + lVar24 * 4) + lVar12 * 8);
            if (pvVar10 != (void *)0x0) {
              operator_delete__(pvVar10);
              iVar22 = (anonymous_namespace)::channelTypes[uVar20];
              piVar11 = (anonymous_namespace)::channelTypes;
              goto LAB_00116ff5;
            }
          }
          else {
LAB_00116ff5:
            if (iVar22 == 1) {
              pvVar10 = *(void **)(*(long *)((long)data._data + lVar24 * 4 + -8) * lVar21 * 8 +
                                   *(long *)((long)&(data._data)->_sizeX + lVar24 * 4) + lVar12 * 8)
              ;
              if (pvVar10 == (void *)0x0) goto LAB_00117059;
              operator_delete__(pvVar10);
              iVar22 = (anonymous_namespace)::channelTypes[uVar20];
              piVar11 = (anonymous_namespace)::channelTypes;
            }
            if ((iVar22 == 2) &&
               (pvVar10 = *(void **)(*(long *)((long)data._data + lVar24 * 4 + -8) * lVar21 * 8 +
                                     *(long *)((long)&(data._data)->_sizeX + lVar24 * 4) +
                                    lVar12 * 8), pvVar10 != (void *)0x0)) {
              operator_delete__(pvVar10);
              piVar11 = (anonymous_namespace)::channelTypes;
            }
          }
LAB_00117059:
          uVar20 = uVar20 + 1;
          lVar24 = lVar24 + 6;
        } while (size != uVar20);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x111);
    lVar21 = lVar21 + 1;
    if (lVar21 == 0xa9) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  --> done",10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                   *)&frameBuffer);
      Imf_3_2::DeepScanLineOutputFile::~DeepScanLineOutputFile(&file);
      Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::~Array(&data);
      return;
    }
  } while( true );
}

Assistant:

void
generateRandomScanFile (
    const std::string& filename, int channelCount, Compression compression)
{
    std::cout << "  generating deep scanline file '" << filename
              << "' compression " << compression << std::endl;
    header = Header (
        displayWindow,
        dataWindow,
        1,
        IMATH_NAMESPACE::V2f (0, 0),
        1,
        INCREASING_Y,
        compression);

    std::default_random_engine generator;
    auto                       generate_random_int = [&] (int range) -> int {
        std::uniform_int_distribution<int> distribution (0, range - 1);
        return distribution (generator);
    };
    //
    // Add channels.
    //

    channelTypes.clear ();

    for (int i = 0; i < channelCount; i++)
    {
        int               type = generate_random_int (3);
        std::stringstream ss;
        ss << i;
        std::string str = ss.str ();
        if (type == 0) header.channels ().insert (str, Channel (IMF::UINT));
        if (type == 1) header.channels ().insert (str, Channel (IMF::HALF));
        if (type == 2) header.channels ().insert (str, Channel (IMF::FLOAT));
        channelTypes.push_back (type);
    }

    header.setType (DEEPSCANLINE);

    Array<Array2D<void*>> data (channelCount);
    for (int i = 0; i < channelCount; i++)
        data[i].resizeErase (height, width);

    sampleCountScans.resizeErase (height, width);

    remove (filename.c_str ());
    DeepScanLineOutputFile file (filename.c_str (), header, 8);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (
        IMF::UINT, // type // 7
        (char*) (&sampleCountScans[0][0] - dataWindow.min.x - dataWindow.min.y * width), // base
        sizeof (unsigned int) * 1,       // xStride
        sizeof (unsigned int) * width)); // yStride

    for (int i = 0; i < channelCount; i++)
    {
        PixelType type = NUM_PIXELTYPES;
        if (channelTypes[i] == 0) type = IMF::UINT;
        if (channelTypes[i] == 1) type = IMF::HALF;
        if (channelTypes[i] == 2) type = IMF::FLOAT;

        std::stringstream ss;
        ss << i;
        std::string str = ss.str ();

        int sampleSize = 0;
        if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
        if (channelTypes[i] == 1) sampleSize = sizeof (half);
        if (channelTypes[i] == 2) sampleSize = sizeof (float);

        int pointerSize = sizeof (char*);

        frameBuffer.insert (
            str, // name // 6
            DeepSlice (
                type, // type // 7
                (char*) (&data[i][0][0] - dataWindow.min.x - dataWindow.min.y * width), // base // 8
                pointerSize * 1,     // xStride// 9
                pointerSize * width, // yStride// 10
                sampleSize));        // sampleStride
    }

    file.setFrameBuffer (frameBuffer);

    for (int i = 0; i < height; i++)
    {
        //
        // Fill in data at the last minute.
        //

        for (int j = 0; j < width; j++)
        {
            sampleCountScans[i][j] = generate_random_int (10) + 1;
            for (int k = 0; k < channelCount; k++)
            {
                if (channelTypes[k] == 0)
                    data[k][i][j] = new unsigned int[sampleCountScans[i][j]];
                if (channelTypes[k] == 1)
                    data[k][i][j] = new half[sampleCountScans[i][j]];
                if (channelTypes[k] == 2)
                    data[k][i][j] = new float[sampleCountScans[i][j]];
                for (unsigned int l = 0; l < sampleCountScans[i][j]; l++)
                {
                    if (channelTypes[k] == 0)
                        ((unsigned int*) data[k][i][j])[l] =
                            (i * width + j) % 2049;
                    if (channelTypes[k] == 1)
                        ((half*) data[k][i][j])[l] = (i * width + j) % 2049;
                    if (channelTypes[k] == 2)
                        ((float*) data[k][i][j])[l] = (i * width + j) % 2049;
                }
            }
        }
    }

    file.writePixels (height);

    for (int i = 0; i < height; i++)
        for (int j = 0; j < width; j++)
            for (int k = 0; k < channelCount; k++)
            {
                if (channelTypes[k] == 0) delete[](unsigned int*) data[k][i][j];
                if (channelTypes[k] == 1) delete[](half*) data[k][i][j];
                if (channelTypes[k] == 2) delete[](float*) data[k][i][j];
            }

    std::cout << "  --> done" << std::endl;
}